

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microsoft_pe.cpp
# Opt level: O0

ssize_t __thiscall
microsoft_pe_t::optional_header_data_dirs_t::_read
          (optional_header_data_dirs_t *this,int __fd,void *__buf,size_t __nbytes)

{
  data_dir_t *pdVar1;
  optional_header_data_dirs_t *this_local;
  
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_export_table = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_import_table = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_resource_table = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_exception_table = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_certificate_table = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_base_relocation_table = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_debug = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_architecture = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_global_ptr = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_tls_table = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_load_config_table = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_bound_import = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_iat = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_delay_import_descriptor = pdVar1;
  pdVar1 = (data_dir_t *)operator_new(0x20);
  data_dir_t::data_dir_t(pdVar1,(this->super_kstruct).m__io,this,this->m__root);
  this->m_clr_runtime_header = pdVar1;
  return (ssize_t)this;
}

Assistant:

void microsoft_pe_t::optional_header_data_dirs_t::_read() {
    m_export_table = new data_dir_t(m__io, this, m__root);
    m_import_table = new data_dir_t(m__io, this, m__root);
    m_resource_table = new data_dir_t(m__io, this, m__root);
    m_exception_table = new data_dir_t(m__io, this, m__root);
    m_certificate_table = new data_dir_t(m__io, this, m__root);
    m_base_relocation_table = new data_dir_t(m__io, this, m__root);
    m_debug = new data_dir_t(m__io, this, m__root);
    m_architecture = new data_dir_t(m__io, this, m__root);
    m_global_ptr = new data_dir_t(m__io, this, m__root);
    m_tls_table = new data_dir_t(m__io, this, m__root);
    m_load_config_table = new data_dir_t(m__io, this, m__root);
    m_bound_import = new data_dir_t(m__io, this, m__root);
    m_iat = new data_dir_t(m__io, this, m__root);
    m_delay_import_descriptor = new data_dir_t(m__io, this, m__root);
    m_clr_runtime_header = new data_dir_t(m__io, this, m__root);
}